

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

MultisamplePixelBufferAccess *
rr::getSubregion(MultisamplePixelBufferAccess *__return_storage_ptr__,
                MultisamplePixelBufferAccess *access,int x,int y,int width,int height)

{
  ConstPixelBufferAccess CStack_38;
  
  tcu::getSubregion((PixelBufferAccess *)&CStack_38,&access->m_access,0,x,y,
                    (access->m_access).super_ConstPixelBufferAccess.m_size.m_data[0],width,height);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)__return_storage_ptr__,&CStack_38);
  return __return_storage_ptr__;
}

Assistant:

MultisamplePixelBufferAccess getSubregion (const MultisamplePixelBufferAccess& access, int x, int y, int width, int height)
{
	return MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getSubregion(access.raw(), 0, x, y, access.getNumSamples(), width, height));
}